

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_rwkv6::llm_build_rwkv6
          (llm_build_rwkv6 *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  size_t sVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ggml_tensor *pgVar14;
  ggml_tensor *cur_00;
  ggml_tensor *pgVar15;
  ggml_tensor *pgVar16;
  ggml_tensor *pgVar17;
  long lVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  ggml_tensor *pgVar21;
  ggml_tensor *pgVar22;
  undefined8 uVar23;
  ggml_tensor *pgVar24;
  ggml_tensor *pgVar25;
  pointer plVar26;
  undefined8 in_RCX;
  long in_RSI;
  llama_ubatch *in_RDI;
  char *pcVar27;
  ggml_tensor *inp_out_ids;
  ggml_tensor *ffn_norm;
  ggml_tensor *ffn_inp;
  ggml_tensor *x_prev;
  ggml_tensor *att_norm;
  ggml_tensor *ffn_shift;
  ggml_tensor *att_shift;
  ggml_tensor *token_shift;
  llama_layer *layer;
  int il;
  uint32_t n_seqs;
  uint32_t n_seq_tokens;
  uint32_t n_embd;
  ggml_tensor *state_mask;
  ggml_tensor *state_copy;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  ggml_tensor *in_stack_fffffffffffffd08;
  int iVar28;
  llm_graph_context *in_stack_fffffffffffffd10;
  undefined4 uVar29;
  llama_model *in_stack_fffffffffffffd18;
  ggml_tensor *in_stack_fffffffffffffd20;
  ggml_tensor *in_stack_fffffffffffffd28;
  llm_graph_context *in_stack_fffffffffffffd30;
  undefined8 in_stack_fffffffffffffd58;
  ggml_tensor *in_stack_fffffffffffffd60;
  ggml_tensor *in_stack_fffffffffffffd68;
  ggml_tensor *in_stack_fffffffffffffd70;
  ggml_tensor *in_stack_fffffffffffffd78;
  ggml_tensor *in_stack_fffffffffffffd80;
  llama_layer *in_stack_fffffffffffffd88;
  llm_build_rwkv6_base *in_stack_fffffffffffffd90;
  ggml_tensor *in_stack_fffffffffffffe18;
  llm_graph_context *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_ffffffffffffff58;
  undefined8 local_98;
  int local_60;
  ggml_tensor *local_40;
  
  llm_build_rwkv6_base::llm_build_rwkv6_base
            ((llm_build_rwkv6_base *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
             (llm_graph_params *)in_stack_fffffffffffffd10);
  if (*(int *)(*(long *)&in_RDI->n_seq_tokens + 0x1898) != 2) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x2d3c,"GGML_ASSERT(%s) failed","hparams.token_shift_count == 2");
  }
  llm_graph_context::build_inp_embd(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  local_40 = llm_graph_context::build_norm
                       (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd20,(ggml_tensor *)in_stack_fffffffffffffd18,
                        (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                        (int)in_stack_fffffffffffffd10);
  pgVar25 = local_40;
  pgVar14 = llm_graph_context::build_inp_s_copy((llm_graph_context *)in_stack_fffffffffffffd70);
  cur_00 = llm_graph_context::build_inp_s_mask((llm_graph_context *)in_stack_fffffffffffffd70);
  uVar1 = *(uint *)(*(long *)&in_RDI->n_seq_tokens + 8);
  fVar2 = in_RDI->embd[2];
  fVar3 = in_RDI->embd[3];
  for (local_60 = 0; iVar28 = (int)((ulong)in_stack_fffffffffffffd08 >> 0x20),
      (long)local_60 < (long)in_RDI->n_seq_id; local_60 = local_60 + 1) {
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)local_60
              );
    uVar19._0_1_ = in_RDI[3].equal_seqs;
    uVar19._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar19._4_4_ = in_RDI[3].n_tokens;
    pgVar15 = (ggml_tensor *)ggml_reshape_3d(uVar19,local_40,uVar1,fVar2,fVar3);
    pgVar24 = pgVar15;
    pgVar16 = llm_graph_context::build_rwkv_token_shift_load
                        ((llm_graph_context *)in_stack_fffffffffffffd80,
                         (ggml_cgraph *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,
                         in_stack_fffffffffffffd68,(llama_ubatch *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    uVar20._0_1_ = in_RDI[3].equal_seqs;
    uVar20._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar20._4_4_ = in_RDI[3].n_tokens;
    pgVar22 = pgVar16;
    pgVar17 = (ggml_tensor *)
              ggml_view_3d(uVar20,pgVar16,uVar1,1,fVar3,pgVar16->nb[1],pgVar16->nb[2],0);
    uVar23._0_1_ = in_RDI[3].equal_seqs;
    uVar23._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar23._4_4_ = in_RDI[3].n_tokens;
    sVar4 = pgVar16->nb[1];
    iVar28 = (int)(pgVar16->nb[2] >> 0x20);
    pgVar21 = pgVar17;
    lVar18 = ggml_element_size();
    pcVar27 = (char *)((ulong)uVar1 * lVar18);
    uVar19 = ggml_view_3d(uVar23,pgVar16,(ulong)uVar1,1,fVar3,sVar4);
    pgVar16 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20,(ggml_tensor *)in_stack_fffffffffffffd18,
                         (llm_norm_type)((ulong)pcVar27 >> 0x20),(int)pcVar27);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,
               (ggml_tensor *)in_stack_fffffffffffffd18,pcVar27,iVar28);
    uVar5._0_1_ = in_RDI[3].equal_seqs;
    uVar5._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar5._4_4_ = in_RDI[3].n_tokens;
    uVar29 = 0;
    uVar20 = ggml_view_3d(uVar5,pgVar16,uVar1,(int)fVar2 + -1,fVar3,pgVar16->nb[1],pgVar16->nb[2],0)
    ;
    ggml_concat(uVar5,pgVar17,uVar20,1);
    iVar28 = (int)((ulong)in_RDI->embd >> 0x20);
    pcVar27 = (char *)CONCAT44(uVar29,local_60);
    pgVar21 = llm_build_rwkv6_base::build_rwkv6_time_mix
                        ((llm_build_rwkv6_base *)pgVar25,(ggml_cgraph *)pgVar14,cur_00,pgVar24,
                         pgVar22,pgVar21,in_RDI,(int)in_stack_ffffffffffffff58);
    uVar6._0_1_ = in_RDI[3].equal_seqs;
    uVar6._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar6._4_4_ = in_RDI[3].n_tokens;
    local_98 = ggml_add(uVar6,pgVar21,pgVar15);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,
               (ggml_tensor *)in_stack_fffffffffffffd18,pcVar27,iVar28);
    pgVar22 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                         in_stack_fffffffffffffd20,(ggml_tensor *)in_stack_fffffffffffffd18,
                         (llm_norm_type)((ulong)pcVar27 >> 0x20),(int)pcVar27);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,
               (ggml_tensor *)in_stack_fffffffffffffd18,pcVar27,iVar28);
    uVar7._0_1_ = in_RDI[3].equal_seqs;
    uVar7._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar7._4_4_ = in_RDI[3].n_tokens;
    uVar20 = ggml_view_3d(uVar7,pgVar22,uVar1,(int)fVar2 + -1,fVar3,pgVar22->nb[1],pgVar22->nb[2],0)
    ;
    uVar19 = ggml_concat(uVar7,uVar19,uVar20,1);
    uVar8._0_1_ = in_RDI[3].equal_seqs;
    uVar8._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar8._4_4_ = in_RDI[3].n_tokens;
    sVar4 = pgVar16->nb[1];
    sVar9 = pgVar16->nb[2];
    lVar18 = ggml_element_size();
    uVar20 = ggml_view_3d(uVar8,pgVar16,uVar1,1,fVar3,sVar4,sVar9,
                          (ulong)(((int)fVar2 + -1) * uVar1) * lVar18);
    uVar10._0_1_ = in_RDI[3].equal_seqs;
    uVar10._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar10._4_4_ = in_RDI[3].n_tokens;
    sVar4 = pgVar22->nb[1];
    in_stack_fffffffffffffd08 = (ggml_tensor *)pgVar22->nb[2];
    lVar18 = ggml_element_size();
    in_stack_fffffffffffffd10 = (llm_graph_context *)((ulong)(((int)fVar2 + -1) * uVar1) * lVar18);
    uVar23 = ggml_view_3d(uVar10,pgVar22,uVar1,1,fVar3,sVar4);
    ggml_concat(uVar8,uVar20,uVar23,1);
    pgVar24 = llm_graph_context::build_rwkv_token_shift_store
                        ((llm_graph_context *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                         (llama_ubatch *)in_stack_fffffffffffffd60,
                         (int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    ggml_build_forward_expand(in_RCX,pgVar24);
    if ((long)local_60 == (long)in_RDI->n_seq_id + -1) {
      in_stack_ffffffffffffff58 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffd60);
      uVar11._0_1_ = in_RDI[3].equal_seqs;
      uVar11._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
      uVar11._4_4_ = in_RDI[3].n_tokens;
      uVar20 = ggml_reshape_2d(uVar11,local_98,uVar1,(long)*(int *)&in_RDI[2].n_seq_id);
      local_98 = ggml_get_rows(uVar11,uVar20,in_stack_ffffffffffffff58);
      in_stack_fffffffffffffd90 = *(llm_build_rwkv6_base **)(in_RDI + 3);
      uVar20 = ggml_reshape_2d(in_stack_fffffffffffffd90,pgVar22,uVar1,
                               (long)*(int *)&in_RDI[2].n_seq_id);
      in_stack_fffffffffffffd88 =
           (llama_layer *)ggml_get_rows(in_stack_fffffffffffffd90,uVar20,in_stack_ffffffffffffff58);
      in_stack_fffffffffffffd78 = *(ggml_tensor **)(in_RDI + 3);
      in_stack_fffffffffffffd80 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffd78,uVar19,uVar1,(long)*(int *)&in_RDI[2].n_seq_id)
      ;
      in_stack_fffffffffffffd70 =
           (ggml_tensor *)
           ggml_get_rows(in_stack_fffffffffffffd78,in_stack_fffffffffffffd80,
                         in_stack_ffffffffffffff58);
      in_stack_fffffffffffffd60 = *(ggml_tensor **)(in_RDI + 3);
      in_stack_fffffffffffffd68 =
           (ggml_tensor *)
           ggml_reshape_2d(in_stack_fffffffffffffd60,pgVar21,uVar1,(long)*(int *)&in_RDI[2].n_seq_id
                          );
      in_stack_fffffffffffffd58 =
           ggml_get_rows(in_stack_fffffffffffffd60,in_stack_fffffffffffffd68,
                         in_stack_ffffffffffffff58);
    }
    pgVar21 = llm_build_rwkv6_base::build_rwkv6_channel_mix
                        (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         (llm_arch)((ulong)in_stack_fffffffffffffd70 >> 0x20));
    uVar12._0_1_ = in_RDI[3].equal_seqs;
    uVar12._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
    uVar12._4_4_ = in_RDI[3].n_tokens;
    uVar19 = ggml_add(uVar12,pgVar21,local_98);
    if (*(int *)(*(long *)&in_RDI->n_seq_tokens + 0x1888) != 0) {
      if ((local_60 + 1U) % *(uint *)(*(long *)&in_RDI->n_seq_tokens + 0x1888) == 0) {
        uVar13._0_1_ = in_RDI[3].equal_seqs;
        uVar13._1_3_ = *(undefined3 *)&in_RDI[3].field_0x1;
        uVar13._4_4_ = in_RDI[3].n_tokens;
        ggml_scale(0x3f000000,uVar13,uVar19);
      }
    }
    local_40 = llm_graph_context::build_cvec(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08,0);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd20,
               (ggml_tensor *)in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10,
               (int)((ulong)in_stack_fffffffffffffd08 >> 0x20));
  }
  pgVar25 = llm_graph_context::build_norm
                      (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20
                       ,(ggml_tensor *)in_stack_fffffffffffffd18,
                       (llm_norm_type)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                       (int)in_stack_fffffffffffffd10);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd20,(ggml_tensor *)in_stack_fffffffffffffd18
             ,(char *)in_stack_fffffffffffffd10,iVar28);
  plVar26 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f8825);
  plVar26->t_embd = pgVar25;
  pgVar14 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,
                       in_stack_fffffffffffffd60);
  llm_graph_context::cb
            ((llm_graph_context *)pgVar25,(ggml_tensor *)in_stack_fffffffffffffd18,
             (char *)in_stack_fffffffffffffd10,iVar28);
  pgVar25 = pgVar14;
  plVar26 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4f88aa);
  plVar26->t_logits = pgVar25;
  ggml_build_forward_expand(in_RCX,pgVar14);
  return;
}

Assistant:

llm_build_rwkv6(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_build_rwkv6_base(model, params) {
        GGML_ASSERT(hparams.token_shift_count == 2);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);
        inpL = build_norm(inpL, model.tok_norm, model.tok_norm_b, LLM_NORM, -1);

        ggml_tensor * state_copy = build_inp_s_copy();
        ggml_tensor * state_mask = build_inp_s_mask();

        const auto n_embd = hparams.n_embd;
        const auto n_seq_tokens = ubatch.n_seq_tokens;
        const auto n_seqs = ubatch.n_seqs;

        for (int il = 0; il < n_layer; ++il) {
            const llama_layer * layer = &model.layers[il];
            inpL = ggml_reshape_3d(ctx0, inpL, n_embd, n_seq_tokens, n_seqs);

            ggml_tensor * token_shift = build_rwkv_token_shift_load(
                    gf, state_copy, state_mask, ubatch, il
                    );

            ggml_tensor * att_shift = ggml_view_3d(ctx0, token_shift, n_embd, 1, n_seqs, token_shift->nb[1], token_shift->nb[2], 0);
            ggml_tensor * ffn_shift = ggml_view_3d(ctx0, token_shift, n_embd, 1, n_seqs, token_shift->nb[1], token_shift->nb[2], n_embd * ggml_element_size(token_shift));

            ggml_tensor * att_norm = build_norm(inpL, layer->attn_norm, layer->attn_norm_b, LLM_NORM, il);
            cb(att_norm, "attn_norm", il);

            ggml_tensor * x_prev = ggml_concat(
                    ctx0,
                    att_shift,
                    ggml_view_3d(ctx0, att_norm, n_embd, n_seq_tokens - 1, n_seqs, att_norm->nb[1], att_norm->nb[2], 0),
                    1
                    );

            cur = build_rwkv6_time_mix(gf, att_norm, x_prev, state_copy, state_mask, ubatch, il);

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpL);
            cb(ffn_inp, "ffn_inp", il);

            ggml_tensor * ffn_norm = build_norm(ffn_inp, layer->attn_norm_2, layer->attn_norm_2_b, LLM_NORM, il);
            cb(ffn_norm, "ffn_norm", il);

            x_prev = ggml_concat(
                    ctx0,
                    ffn_shift,
                    ggml_view_3d(ctx0, ffn_norm, n_embd, n_seq_tokens - 1, n_seqs, ffn_norm->nb[1], ffn_norm->nb[2], 0),
                    1
                    );

            token_shift = ggml_concat(ctx0,
                    ggml_view_3d(ctx0, att_norm, n_embd, 1, n_seqs, att_norm->nb[1], att_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(att_norm)),
                    ggml_view_3d(ctx0, ffn_norm, n_embd, 1, n_seqs, ffn_norm->nb[1], ffn_norm->nb[2], (n_seq_tokens-1)*n_embd*ggml_element_size(ffn_norm)),
                    1
                    );
            ggml_build_forward_expand(gf, build_rwkv_token_shift_store(token_shift, ubatch, il));

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                struct ggml_tensor * inp_out_ids = build_inp_out_ids();
                ffn_inp  = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_inp,  n_embd, n_tokens), inp_out_ids);
                ffn_norm = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, ffn_norm, n_embd, n_tokens), inp_out_ids);
                x_prev   = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, x_prev,   n_embd, n_tokens), inp_out_ids);
                cur      = ggml_get_rows(ctx0, ggml_reshape_2d(ctx0, cur,      n_embd, n_tokens), inp_out_ids);
            }

            cur = build_rwkv6_channel_mix(layer, ffn_norm, x_prev, LLM_ARCH_RWKV6);
            cur = ggml_add(ctx0, cur, ffn_inp);

            if (hparams.rescale_every_n_layers != 0 && (il + 1) % hparams.rescale_every_n_layers == 0) {
                cur = ggml_scale(ctx0, cur, 0.5F);
            }

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;
        cur = build_norm(cur, model.output_norm, model.output_norm_b, LLM_NORM, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }